

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test22(void)

{
  pointer *this;
  bool bVar1;
  test_failure *this_00;
  allocator<char> local_2949;
  string local_2948;
  string local_2928;
  allocator<char> local_2901;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28c0;
  size_t local_28a0;
  int local_2898;
  undefined1 local_2892;
  allocator<char> local_2891;
  string local_2890;
  string local_2870;
  allocator<char> local_2849;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2808;
  undefined1 local_27e8 [28];
  int x_2;
  undefined1 local_27b8 [28];
  int x_1;
  bitset<500UL> accountedFor;
  string local_2758;
  undefined1 local_2738 [8];
  StackVector<CMString> output;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20e0;
  undefined1 local_20c8 [8];
  ConfusableMatcher matcher;
  string local_b8;
  char *local_98;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  int local_24;
  undefined1 local_20 [4];
  int x;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  for (local_24 = 0; local_24 < 500; local_24 = local_24 + 1) {
    local_98 = "123";
    std::__cxx11::to_string(&local_b8,local_24);
    std::
    pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_90,&local_98,&local_b8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_68,&local_90);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_20,&local_68);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_68);
    std::
    pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20e0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  output.Heap.super__Vector_base<CMString,_std::allocator<CMString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &output.Heap.super__Vector_base<CMString,_std::allocator<CMString>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this);
  ConfusableMatcher::ConfusableMatcher
            ((ConfusableMatcher *)local_20c8,&local_20e0,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,false);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&output.Heap.super__Vector_base<CMString,_std::allocator<CMString>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20e0);
  StackVector<CMString>::StackVector((StackVector<CMString> *)local_2738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2758,"123",
             (allocator<char> *)((long)accountedFor.super__Base_bitset<8UL>._M_w + 0x3f));
  ConfusableMatcher::GetKeyMappings
            ((ConfusableMatcher *)local_20c8,&local_2758,(StackVector<CMString> *)local_2738);
  std::__cxx11::string::~string((string *)&local_2758);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)accountedFor.super__Base_bitset<8UL>._M_w + 0x3f));
  std::bitset<500UL>::bitset((bitset<500UL> *)(local_27b8 + 0x18));
  for (local_27b8._20_4_ = 0; (int)local_27b8._20_4_ < 500;
      local_27b8._20_4_ = local_27b8._20_4_ + 1) {
    StackVector<CMString>::GetElement
              ((CMString *)(local_27e8 + 0x18),(StackVector<CMString> *)local_2738,
               (long)(int)local_27b8._20_4_);
    atoi(stack0xffffffffffffd830);
    std::bitset<500UL>::operator[]((bitset<500UL> *)local_27b8,(size_t)(local_27b8 + 0x18));
    std::bitset<500UL>::reference::operator=((reference *)local_27b8,true);
    std::bitset<500UL>::reference::~reference((reference *)local_27b8);
  }
  local_27e8._20_4_ = 0;
  while( true ) {
    if (499 < (int)local_27e8._20_4_) {
      local_2898 = 500;
      local_28a0 = StackVector<CMString>::Size((StackVector<CMString> *)local_2738);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2900,"Test22",&local_2901)
      ;
      std::operator+(&local_28e0,&local_2900,": ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2948,"500 == output.Size()",&local_2949);
      cute::cute_to_string::backslashQuoteTabNewline(&local_2928,&local_2948);
      std::operator+(&local_28c0,&local_28e0,&local_2928);
      cute::assert_equal<int,unsigned_long>
                (&local_2898,&local_28a0,&local_28c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
                 ,0x25d);
      std::__cxx11::string::~string((string *)&local_28c0);
      std::__cxx11::string::~string((string *)&local_2928);
      std::__cxx11::string::~string((string *)&local_2948);
      std::allocator<char>::~allocator(&local_2949);
      std::__cxx11::string::~string((string *)&local_28e0);
      std::__cxx11::string::~string((string *)&local_2900);
      std::allocator<char>::~allocator(&local_2901);
      StackVector<CMString>::~StackVector((StackVector<CMString> *)local_2738);
      ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_20c8);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_20);
      return;
    }
    std::bitset<500UL>::operator[]((bitset<500UL> *)local_27e8,(size_t)(local_27b8 + 0x18));
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_27e8);
    std::bitset<500UL>::reference::~reference((reference *)local_27e8);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    local_27e8._20_4_ = local_27e8._20_4_ + 1;
  }
  local_2892 = 1;
  this_00 = (test_failure *)__cxa_allocate_exception(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2848,"Test22",&local_2849);
  std::operator+(&local_2828,&local_2848,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2890,"accountedFor[x]",&local_2891);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2870,&local_2890);
  std::operator+(&local_2808,&local_2828,&local_2870);
  cute::test_failure::test_failure
            (this_00,&local_2808,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x25a);
  local_2892 = 0;
  __cxa_throw(this_00,&cute::test_failure::typeinfo,cute::test_failure::~test_failure);
}

Assistant:

void Test22()
{
	std::vector<std::pair<std::string, std::string>> map;
	for (auto x = 0;x < 500;x++)
		map.push_back(std::pair("123", std::to_string(x)));

	auto matcher = ConfusableMatcher(map, {}, false);

	StackVector<CMString> output;
	matcher.GetKeyMappings("123", output);

	std::bitset<500> accountedFor;

	for (auto x = 0;x < 500;x++) {
		accountedFor[std::atoi(output.GetElement(x).Str)] = true;
	}

	for (auto x = 0;x < 500;x++) {
		ASSERT(accountedFor[x]);
	}

	ASSERT_EQUAL(500, output.Size());
}